

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

void trb_print_family_tree(trt_wrapper wr,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  uint32_t max_gap_before_type;
  long lVar1;
  trt_node *ptVar2;
  trt_node *ptVar3;
  ulong uVar4;
  byte bVar5;
  trt_parent_cache tVar6;
  trt_parent_cache tVar7;
  trt_parent_cache ca;
  trt_node node;
  trt_node local_f0;
  trt_node local_90;
  
  bVar5 = 0;
  if ((&tc->pn)[(ulong)(tc->lysc_tree != '\0') * 2] != (lysp_node *)0x0) {
    uVar4 = 0x1000400000000;
    max_gap_before_type = trb_max_gap_to_type((trt_parent_cache)ZEXT816(0x1000400000000),pc,tc);
    if (((tc->lysc_tree == '\0') && (tc->section == TRD_SECT_GROUPING)) &&
       (tc->tpn == tc->pn->parent)) {
      uVar4 = 0x400000000;
    }
    tVar6.last_list = (lysp_node_list *)0x0;
    tVar6.ancestor = (int)uVar4;
    tVar6.lys_status = (short)(uVar4 >> 0x20);
    tVar6.lys_config = (short)(uVar4 >> 0x30);
    (*(pc->fp).modify.first_sibling)(&local_f0,tVar6,tc);
    if (((local_f0.iffeatures.type != TRD_IFF_NON_PRESENT) || (local_f0.type.type != TRD_TYPE_EMPTY)
        ) || ((local_f0.name.str != (char *)0x0 ||
              ((local_f0.flags != (char *)0x0 || (local_f0.status != (char *)0x0)))))) {
      do {
        ly_print_(pc->out,"\n");
        ca.last_list = (lysp_node_list *)0x0;
        ca.ancestor = (int)uVar4;
        ca.lys_status = (short)(uVar4 >> 0x20);
        ca.lys_config = (short)(uVar4 >> 0x30);
        trb_print_subtree_nodes(&local_f0,max_gap_before_type,wr,ca,pc,tc);
        tVar7.last_list = (lysp_node_list *)0x0;
        tVar7.ancestor = (int)uVar4;
        tVar7.lys_status = (short)(uVar4 >> 0x20);
        tVar7.lys_config = (short)(uVar4 >> 0x30);
        (*(pc->fp).modify.next_sibling)(&local_90,tVar7,tc);
        ptVar2 = &local_90;
        ptVar3 = &local_f0;
        for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
          ptVar3->status = ptVar2->status;
          ptVar2 = (trt_node *)((long)ptVar2 + (ulong)bVar5 * -0x10 + 8);
          ptVar3 = (trt_node *)((long)ptVar3 + (ulong)bVar5 * -0x10 + 8);
        }
      } while ((((local_f0.iffeatures.type != TRD_IFF_NON_PRESENT) ||
                (local_f0.type.type != TRD_TYPE_EMPTY)) || (local_f0.name.str != (char *)0x0)) ||
              ((local_f0.flags != (char *)0x0 || (local_f0.status != (char *)0x0))));
    }
  }
  return;
}

Assistant:

static void
trb_print_family_tree(struct trt_wrapper wr, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_parent_cache ca;
    struct trt_node node;
    uint32_t max_gap_before_type;

    if (!tro_tree_ctx_get_node(tc)) {
        return;
    }

    ca = TRP_EMPTY_PARENT_CACHE;
    max_gap_before_type = trb_try_unified_indent(ca, pc, tc);

    if (!tc->lysc_tree) {
        if ((tc->section == TRD_SECT_GROUPING) && (tc->tpn == tc->pn->parent)) {
            ca.lys_config = 0x0;
        }
    }

    for (node = pc->fp.modify.first_sibling(ca, tc);
            !trp_node_is_empty(&node);
            node = pc->fp.modify.next_sibling(ca, tc)) {
        ly_print_(pc->out, "\n");
        trb_print_subtree_nodes(&node, max_gap_before_type, wr, ca, pc, tc);
    }
}